

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          ClassNameResolver *name_resolver)

{
  FieldDescriptor *pFVar1;
  JavaType JVar2;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  char *pcVar3;
  allocator local_21;
  FieldDescriptor *local_20;
  ClassNameResolver *name_resolver_local;
  FieldDescriptor *field_local;
  
  local_20 = field;
  name_resolver_local = (ClassNameResolver *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  JVar2 = GetJavaType((FieldDescriptor *)this);
  pFVar1 = local_20;
  if (JVar2 == JAVATYPE_MESSAGE) {
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)name_resolver_local);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (__return_storage_ptr__,(ClassNameResolver *)pFVar1,descriptor);
  }
  else {
    JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
    pFVar1 = local_20;
    if (JVar2 == JAVATYPE_ENUM) {
      descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)name_resolver_local);
      ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
                (__return_storage_ptr__,(ClassNameResolver *)pFVar1,descriptor_00);
    }
    else {
      JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
      pcVar3 = KotlinTypeName(JVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_21);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string KotlinTypeName(const FieldDescriptor* field,
                           ClassNameResolver* name_resolver) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return KotlinTypeName(GetJavaType(field));
  }
}